

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoNode.cc
# Opt level: O2

void __thiscall
VideoNode::VideoNode(VideoNode *this,path *project_root,string_view video_config_filename)

{
  PolledPipelineDesc *this_00;
  PolledFile *this_01;
  Resources *this_02;
  string_view filename;
  shared_ptr<PolledFile> sStack_108;
  string local_f8;
  string_view video_config_filename_local;
  path local_c8;
  string local_88;
  path local_68;
  
  video_config_filename_local._M_str = video_config_filename._M_str;
  video_config_filename_local._M_len = video_config_filename._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"VideoNode",(allocator<char> *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"video",(allocator<char> *)&local_f8);
  INode::INode(&this->super_INode,&local_c8._M_pathname,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__VideoNode_001ea720;
  this->mode_index = 1;
  (this->preview).w = 0x500;
  (this->preview).h = 0x2d0;
  this_00 = (PolledPipelineDesc *)operator_new(0x28);
  this_01 = (PolledFile *)operator_new(0x10);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (&local_68,&video_config_filename_local);
  std::experimental::filesystem::v1::__cxx11::operator/(&local_c8,project_root,&local_68);
  std::experimental::filesystem::v1::__cxx11::path::string(&local_f8,&local_c8);
  filename._M_str = local_f8._M_dataplus._M_p;
  filename._M_len = local_f8._M_string_length;
  PolledFile::PolledFile(this_01,filename);
  std::__shared_ptr<PolledFile,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<PolledFile,void>
            ((__shared_ptr<PolledFile,(__gnu_cxx::_Lock_policy)2> *)&sStack_108,this_01);
  PolledPipelineDesc::PolledPipelineDesc(this_00,&sStack_108);
  (this->polled_pipeline)._M_t.
  super___uniq_ptr_impl<PolledPipelineDesc,_std::default_delete<PolledPipelineDesc>_>._M_t.
  super__Tuple_impl<0UL,_PolledPipelineDesc_*,_std::default_delete<PolledPipelineDesc>_>.
  super__Head_base<0UL,_PolledPipelineDesc_*,_false>._M_head_impl = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_108.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_f8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_c8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_68);
  this_02 = (Resources *)operator_new(0xd8);
  Resources::Resources(this_02,project_root);
  (this->resources)._M_t.super___uniq_ptr_impl<Resources,_std::default_delete<Resources>_>._M_t.
  super__Tuple_impl<0UL,_Resources_*,_std::default_delete<Resources>_>.
  super__Head_base<0UL,_Resources_*,_false>._M_head_impl = this_02;
  (this->engine)._M_t.super___uniq_ptr_impl<VideoEngine,_std::default_delete<VideoEngine>_>._M_t.
  super__Tuple_impl<0UL,_VideoEngine_*,_std::default_delete<VideoEngine>_>.
  super__Head_base<0UL,_VideoEngine_*,_false>._M_head_impl = (VideoEngine *)0x0;
  return;
}

Assistant:

VideoNode::VideoNode(fs::path project_root, std::string_view video_config_filename)
	: INode("VideoNode", "video")
	, preview{1280, 720}
	, polled_pipeline(new PolledPipelineDesc(
		std::shared_ptr<PolledFile>(
			new PolledFile(
				(project_root/video_config_filename).string()))))
	, resources(new Resources(project_root)) {
	GL_LOAD_FUNCS
}

VideoNode::~VideoNode() {}

void VideoNode::paint(float dt, const Timecode& tc, IScope &scope) {
	static unsigned int frame_seq = 0;
	frame_seq++;

	if (polled_pipeline->poll(frame_seq)) {
		engine.reset(new VideoEngine(*resources, polled_pipeline->get()));
		engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (engine)
		engine->paint(frame_seq, preview.w, preview.h, tc.row, dt, scope);
}

// void video_export(const ExportSettings &settings, const IAutomation &automation) {
// 	if (polled_pipeline && polled_pipeline->get()) {
// 		auto result = exportC(*resources, settings, *polled_pipeline->get().get(), automation);
// 		if (!result)
// 			MSG("Export error: %s", result.error().c_str());
// 	}
// }

void VideoNode::doUi() noexcept {
	if (ImGui::Combo("Resolution", &mode_index, c_mode_names, COUNTOF(c_mode_names))) {
		if (engine)
			engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (ImGui::Button("Make screensot") && engine) {
		// TODO filename picker
		// TODO incrementable filenames
		// TODO project-relative

		const char *filename = "screenshot.jpg";
		const Image screen = engine->makeScreenshot();
		const int result = stbi_write_jpg(filename, screen.w, screen.h, 3, screen.data.data(), 80);
		MSG("screenshot written to file %s, result: %d", filename, result);
	}
}

const renderdesc::Pipeline& VideoNode::getPipelineDesc() const {
	return *polled_pipeline->get().get();
}